

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

void QTimer::singleShot(nanoseconds ns,TimerType timerType,QObject *receiver,char *member)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  char *in_RCX;
  Duration in_RDX;
  long in_FS_OFFSET;
  char *bracketPosition;
  QByteArrayView methodName;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QByteArrayView *in_stack_fffffffffffffef8;
  ConnectionType c;
  QMessageLogger *in_stack_ffffffffffffff00;
  QByteArrayView *this;
  char *in_stack_ffffffffffffff08;
  QObject *obj;
  QObject *in_stack_ffffffffffffff10;
  TimerType in_stack_ffffffffffffff1c;
  QSingleShotTimer *in_stack_ffffffffffffff20;
  QObject local_b0;
  QByteArrayView local_98;
  QByteArrayView local_88;
  QMessageLogger local_70;
  rep local_50;
  rep local_48;
  QMessageLogger local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ns<(char)48>();
  bVar2 = std::chrono::operator<
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffef8,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (bVar2) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4
               ,(char *)in_stack_fffffffffffffee8);
    QMessageLogger::warning
              (&local_38,
               "QTimer::singleShot: negative intervals aren\'t allowed; the interval will be set to 1ms."
              );
    local_48 = (rep)ms<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
  }
  if ((in_RDX.__r != 0) && (in_RCX != (char *)0x0)) {
    local_50 = (rep)ns<(char)48>();
    bVar2 = std::chrono::operator==
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffef8,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (bVar2) {
      pcVar3 = strchr(in_RCX,0x28);
      if (((pcVar3 == (char *)0x0) || (*in_RCX < '0')) || ('2' < *in_RCX)) {
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef4,(char *)in_stack_fffffffffffffee8);
        QMessageLogger::warning(&local_70,"QTimer::singleShot: Invalid slot specification");
      }
      else {
        local_88.m_data = &DAT_aaaaaaaaaaaaaaaa;
        local_88.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        this = &local_98;
        QByteArrayView::QByteArrayView<char,_true>
                  (this,(char *)in_stack_fffffffffffffef8,
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        local_88 = QByteArrayView::trimmed(in_stack_fffffffffffffef8);
        c = (ConnectionType)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        obj = &local_b0;
        QByteArrayView::toByteArray
                  ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        QByteArray::constData((QByteArray *)0x42b90e);
        QMetaObject::invokeMethod<>(obj,(char *)this,c);
        QByteArray::~QByteArray((QByteArray *)0x42b92c);
      }
    }
    else {
      operator_new(0x18);
      QSingleShotTimer::QSingleShotTimer
                (in_stack_ffffffffffffff20,in_RDX,in_stack_ffffffffffffff1c,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimer::singleShot(std::chrono::nanoseconds ns, Qt::TimerType timerType,
                        const QObject *receiver, const char *member)
{
    if (ns < 0ns) {
        qWarning("QTimer::singleShot: negative intervals aren't allowed; the "
                 "interval will be set to 1ms.");
        ns = 1ms;
    }
    if (receiver && member) {
        if (ns == 0ns) {
            // special code shortpath for 0-timers
            const char* bracketPosition = strchr(member, '(');
            if (!bracketPosition || !(member[0] >= '0' && member[0] <= '2')) {
                qWarning("QTimer::singleShot: Invalid slot specification");
                return;
            }
            const auto methodName = QByteArrayView(member + 1, // extract method name
                                                   bracketPosition - 1 - member).trimmed();
            QMetaObject::invokeMethod(const_cast<QObject *>(receiver), methodName.toByteArray().constData(),
                                      Qt::QueuedConnection);
            return;
        }
        (void) new QSingleShotTimer(ns, timerType, receiver, member);
    }
}